

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void wiz_play_item_standard_upkeep(player *p,object *obj)

{
  _Bool _Var1;
  object *obj_local;
  player *p_local;
  
  _Var1 = object_is_carried(p,obj);
  if (_Var1) {
    p->upkeep->update = p->upkeep->update | 0x201;
    p->upkeep->notice = p->upkeep->notice | 1;
    p->upkeep->redraw = p->upkeep->redraw | 0x60000;
  }
  else {
    p->upkeep->redraw = p->upkeep->redraw | 0x800000;
  }
  return;
}

Assistant:

static void wiz_play_item_standard_upkeep(struct player *p, struct object *obj)
{
	if (object_is_carried(p, obj)) {
		p->upkeep->update |= (PU_BONUS | PU_INVEN);
		p->upkeep->notice |= (PN_COMBINE);
		p->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	} else {
		p->upkeep->redraw |= (PR_ITEMLIST);
	}
}